

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize.cpp
# Opt level: O2

VkPipelineShaderStageCreateInfo * __thiscall
Fossilize::StateRecorder::Impl::copy<VkPipelineShaderStageCreateInfo>
          (Impl *this,VkPipelineShaderStageCreateInfo *src,size_t count,ScratchAllocator *alloc)

{
  VkPipelineShaderStageCreateInfo *pVVar1;
  
  if (count != 0) {
    pVVar1 = ScratchAllocator::allocate_n<VkPipelineShaderStageCreateInfo>(alloc,count);
    if (pVVar1 != (VkPipelineShaderStageCreateInfo *)0x0) {
      pVVar1 = (VkPipelineShaderStageCreateInfo *)memmove(pVVar1,src,count * 0x30);
      return pVVar1;
    }
  }
  return (VkPipelineShaderStageCreateInfo *)0x0;
}

Assistant:

T *StateRecorder::Impl::copy(const T *src, size_t count, ScratchAllocator &alloc)
{
	if (!count)
		return nullptr;

	auto *new_data = alloc.allocate_n<T>(count);
	if (new_data)
		std::copy(src, src + count, new_data);
	return new_data;
}